

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

void Cmd_RunAutoTuner(char *pConfig,char *pFileList,int nCores)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Wec_t *vPars;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  satoko_opts_t *pOpts;
  void *pvVar4;
  abctime aVar5;
  abctime aVar6;
  void *pvVar7;
  Gia_Man_t *p_01;
  abctime time;
  abctime time_00;
  int i;
  int i_00;
  long lVar8;
  Vec_Int_t *__ptr;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  aVar3 = Abc_Clock();
  vPars = Cmd_ReadParamChoices(pConfig);
  p = Cmd_ReadFiles(pFileList);
  if (vPars != (Vec_Wec_t *)0x0) {
    p_00 = Cmf_CreateOptions(vPars);
    if (p_00 != (Vec_Ptr_t *)0x0 && p != (Vec_Ptr_t *)0x0) {
      uVar11 = 0x7fffffff;
      iVar9 = 1;
      pvVar7 = (void *)0x0;
      while( true ) {
        uVar10 = (uint)uVar11;
        if (p_00->nSize <= iVar9) break;
        pOpts = (satoko_opts_t *)Vec_PtrEntry(p_00,iVar9 + -1);
        pvVar4 = Vec_PtrEntry(p_00,iVar9);
        aVar5 = Abc_Clock();
        printf("Evaluating settings: %20s...  \n",pvVar4);
        uVar2 = Cmd_RunAutoTunerEval(p,pOpts,nCores);
        printf("Cost = %6d.  ",(ulong)uVar2);
        aVar6 = Abc_Clock();
        Abc_PrintTime(0x82525c,(char *)(aVar6 - aVar5),time);
        uVar1 = uVar10;
        if ((int)uVar2 <= (int)uVar10) {
          uVar1 = uVar2;
        }
        uVar11 = (ulong)uVar1;
        if ((int)uVar2 < (int)uVar10) {
          pvVar7 = pvVar4;
        }
        iVar9 = iVar9 + 2;
      }
      printf("The best settings are: %20s    \n",pvVar7);
      printf("Best cost = %6d.  ",uVar11);
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x7ac294,(char *)(aVar5 - aVar3),time_00);
    }
    __ptr = vPars->pArray;
    lVar8 = 8;
    for (lVar12 = 0; lVar12 < vPars->nCap; lVar12 = lVar12 + 1) {
      pvVar7 = *(void **)((long)&__ptr->nCap + lVar8);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        __ptr = vPars->pArray;
        *(undefined8 *)((long)&__ptr->nCap + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    }
    free(__ptr);
    free(vPars);
    if (p_00 != (Vec_Ptr_t *)0x0) {
      for (iVar9 = 0; iVar9 < p_00->nSize; iVar9 = iVar9 + 1) {
        pvVar7 = Vec_PtrEntry(p_00,iVar9);
        if ((void *)0x2 < pvVar7) {
          free(pvVar7);
        }
      }
      Vec_PtrFree(p_00);
    }
  }
  if (p != (Vec_Ptr_t *)0x0) {
    iVar9 = p->nSize;
    i_00 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
      i_00 = 0;
    }
    for (; iVar9 != i_00; i_00 = i_00 + 1) {
      p_01 = (Gia_Man_t *)Vec_PtrEntry(p,i_00);
      Gia_ManStop(p_01);
    }
    Vec_PtrFree(p);
    return;
  }
  return;
}

Assistant:

void Cmd_RunAutoTuner( char * pConfig, char * pFileList, int nCores )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vPars = Cmd_ReadParamChoices( pConfig );
    Vec_Ptr_t * vAigs = Cmd_ReadFiles( pFileList );
    Vec_Ptr_t * vOpts = vPars ? Cmf_CreateOptions( vPars ) : NULL;
    int i; char * pString, * pStringBest = NULL;
    satoko_opts_t * pOpts, * pOptsBest = NULL;
    int Result, ResultBest = 0x7FFFFFFF;
    Gia_Man_t * pGia; 
    // iterate through all possible option settings
    if ( vAigs && vOpts )
    {
        Vec_PtrForEachEntryDouble( satoko_opts_t *, char *, vOpts, pOpts, pString, i )
        {
            abctime clk = Abc_Clock();
            printf( "Evaluating settings: %20s...  \n", pString );
            Result = Cmd_RunAutoTunerEval( vAigs, pOpts, nCores );
            printf( "Cost = %6d.  ", Result );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            if ( ResultBest > Result )
            {
                ResultBest = Result;
                pStringBest = pString;
                pOptsBest = pOpts;
            }
        }
        printf( "The best settings are: %20s    \n", pStringBest );
        printf( "Best cost = %6d.  ", ResultBest );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    // cleanup
    if ( vPars ) Vec_WecFree( vPars );
    if ( vOpts ) Vec_PtrFreeFree( vOpts );
    if ( vAigs )
    {
        Vec_PtrForEachEntry( Gia_Man_t *, vAigs, pGia, i )
            Gia_ManStop( pGia );
        Vec_PtrFree( vAigs );
    }
}